

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::GreaterThanTest<char,unsigned_long_long>(void)

{
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  bool bVar1;
  uint in_stack_ffffffffffffffd8;
  uint uVar2;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar4;
  undefined7 in_stack_ffffffffffffffe0;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffe7;
  
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffffe7.m_int,in_stack_ffffffffffffffe0),
             (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bVar1 = ::operator>(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffe7);
  uVar2 = in_stack_ffffffffffffffd8 & 0xffffff;
  uVar3 = uVar2;
  if (bVar1) {
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT17(in_stack_ffffffffffffffe7.m_int,in_stack_ffffffffffffffe0),
               (int *)(CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8) &
                      0xffffffff00ffffff));
    bVar1 = ::operator>(in_stack_ffffffffffffffe7,CONCAT44(in_stack_ffffffffffffffdc,uVar2));
    uVar3 = uVar2 & 0xffffff;
    if (bVar1) {
      SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT17(in_stack_ffffffffffffffe7.m_int,in_stack_ffffffffffffffe0),
                 (int *)(CONCAT44(in_stack_ffffffffffffffdc,uVar2) & 0xffffffff00ffffff));
      uVar4 = 7;
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                    *)CONCAT17(in_stack_ffffffffffffffe7.m_int,in_stack_ffffffffffffffe0),
                   (int *)CONCAT44(7,uVar3));
      rhs.m_int._4_4_ = uVar4;
      rhs.m_int._0_4_ = uVar3;
      bVar1 = ::operator>(in_stack_ffffffffffffffe7,rhs);
      uVar3 = (uint)bVar1 << 0x18;
    }
  }
  return SUB41(uVar3 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool GreaterThanTest()
	{
		return
			(U)2 > SafeInt<T>(3) &&
			SafeInt<T>(4) > (U)5 &&
			SafeInt<T>(6) > SafeInt<U>(7);
	}